

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go.h
# Opt level: O1

double __thiscall GoState<3U,_3U>::get_result(GoState<3U,_3U> *this,int current_player_to_move)

{
  int iVar1;
  int iVar2;
  double dVar3;
  
  iVar1 = (*this->_vptr_GoState[0xd])(this,1);
  iVar2 = (*this->_vptr_GoState[0xd])(this,2);
  if (iVar1 == iVar2) {
    dVar3 = 0.5;
  }
  else {
    dVar3 = 0.0;
    if ((iVar1 <= iVar2) + 1 != current_player_to_move) {
      dVar3 = 1.0;
    }
  }
  return dVar3;
}

Assistant:

virtual double get_result(int current_player_to_move) const
	{
		int score1 = get_player_score(1);
		int score2 = get_player_score(2);

		if (score1 == score2) {
			return 0.5;
		}
		int winner = 0;
		if (score1 > score2) {
			winner = 1;
		}
		else {
			winner = 2;
		}

		if (winner == current_player_to_move) {
			return 0.0;
		}
		else {
			return 1.0;
		}
	}